

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O1

void duckdb::ExtractPivotAggregateExpression
               (ClientContext *context,ParsedExpression *expr,
               vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> *aggregates)

{
  pointer *pprVar1;
  iterator __position;
  FunctionExpression *pFVar2;
  CatalogEntry *pCVar3;
  BinderException *this;
  EntryLookupInfo lookup_info;
  reference_wrapper<duckdb::FunctionExpression> local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QueryErrorContext local_38;
  
  if ((expr->super_BaseExpression).type == FUNCTION) {
    pFVar2 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
    QueryErrorContext::QueryErrorContext(&local_38,expr);
    EntryLookupInfo::EntryLookupInfo
              ((EntryLookupInfo *)&local_58,AGGREGATE_FUNCTION_ENTRY,&pFVar2->function_name,local_38
              );
    pCVar3 = Catalog::GetEntry(context,&pFVar2->catalog,&pFVar2->schema,(EntryLookupInfo *)&local_58
                              );
    if (pCVar3->type == AGGREGATE_FUNCTION_ENTRY) {
      __position._M_current =
           (aggregates->
           super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (aggregates->
          super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
          ).
          super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        (__position._M_current)->_M_data = pFVar2;
        pprVar1 = &(aggregates->
                   super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
        return;
      }
      local_60._M_data = pFVar2;
      ::std::
      vector<std::reference_wrapper<duckdb::FunctionExpression>,std::allocator<std::reference_wrapper<duckdb::FunctionExpression>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::FunctionExpression>>
                ((vector<std::reference_wrapper<duckdb::FunctionExpression>,std::allocator<std::reference_wrapper<duckdb::FunctionExpression>>>
                  *)aggregates,__position,&local_60);
      return;
    }
  }
  if ((expr->super_BaseExpression).type != COLUMN_REF) {
    pcStack_40 = ::std::
                 _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:90:12)>
                 ::_M_invoke;
    local_48 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:90:12)>
               ::_M_manager;
    local_58._M_unused._M_object = context;
    local_58._8_8_ = aggregates;
    ParsedExpressionIterator::EnumerateChildren
              (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    return;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  local_58._M_unused._M_object = &local_48;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "Columns can only be referenced within the aggregate of a PIVOT expression","");
  BinderException::BinderException<>(this,expr,(string *)&local_58);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ExtractPivotAggregateExpression(ClientContext &context, ParsedExpression &expr,
                                     vector<reference<FunctionExpression>> &aggregates) {
	if (expr.GetExpressionType() == ExpressionType::FUNCTION) {
		auto &aggr_function = expr.Cast<FunctionExpression>();

		// check if this is an aggregate to ensure it is an aggregate and not a scalar function
		EntryLookupInfo lookup_info(CatalogType::AGGREGATE_FUNCTION_ENTRY, aggr_function.function_name, expr);
		auto &entry = Catalog::GetEntry(context, aggr_function.catalog, aggr_function.schema, lookup_info);
		if (entry.type == CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			// aggregate
			aggregates.push_back(aggr_function);
			return;
		}
	}
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		throw BinderException(expr, "Columns can only be referenced within the aggregate of a PIVOT expression");
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](ParsedExpression &child) { ExtractPivotAggregateExpression(context, child, aggregates); });
}